

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverLifetimesTest_NotIntroduced_Test::
~FeatureResolverLifetimesTest_NotIntroduced_Test
          (FeatureResolverLifetimesTest_NotIntroduced_Test *this)

{
  FeatureResolverLifetimesTest_NotIntroduced_Test *this_local;
  
  ~FeatureResolverLifetimesTest_NotIntroduced_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FeatureResolverLifetimesTest, NotIntroduced) {
  FeatureSet features = ParseTextOrDie(R"pb(
    [pb.test] { future_feature: VALUE1 }
  )pb");
  auto results = FeatureResolver::ValidateFeatureLifetimes(EDITION_2023,
                                                           features, nullptr);
  EXPECT_THAT(results.errors,
              ElementsAre(AllOf(HasSubstr("pb.TestFeatures.future_feature"),
                                HasSubstr("introduced until edition 2024"))));
  EXPECT_THAT(results.warnings, IsEmpty());
}